

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_solvers.h
# Opt level: O0

vector<Solver,_std::allocator<Solver>_> * GetAllSolvers(void)

{
  Solver *in_RDI;
  vector<Solver,_std::allocator<Solver>_> *solvers;
  Solver *__args;
  allocator *desc;
  string *in_stack_ffffffffffffff38;
  string local_c0 [4];
  uint32_t in_stack_ffffffffffffff44;
  SolverFn *in_stack_ffffffffffffff48;
  Solver *in_stack_ffffffffffffff50;
  allocator local_89;
  string local_88 [127];
  undefined1 local_9;
  
  local_9 = 0;
  __args = in_RDI;
  std::vector<Solver,_std::allocator<Solver>_>::vector
            ((vector<Solver,_std::allocator<Solver>_> *)0x102fc9);
  desc = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"tdoku",desc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"T/shrc+./m+",(allocator *)&stack0xffffffffffffff3f);
  Solver::Solver(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                 in_stack_ffffffffffffff38,(string *)desc,(uint32_t)((ulong)__args >> 0x20));
  std::vector<Solver,_std::allocator<Solver>_>::emplace_back<Solver>
            ((vector<Solver,_std::allocator<Solver>_> *)desc,__args);
  Solver::~Solver(in_RDI);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return (vector<Solver,_std::allocator<Solver>_> *)__args;
}

Assistant:

std::vector<Solver> GetAllSolvers() {
    std::vector<Solver> solvers;
    // @formatter:off

#ifdef GSS
    solvers.emplace_back(Solver(OtherSolverGss,               1, "gss1",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               2, "gss2",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               3, "gss3",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               4, "gss4",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               5, "gss5",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               6, "gss6",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               7, "gss7",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               8, "gss8",                      "           ", 15));
    solvers.emplace_back(Solver(OtherSolverGss,               0, "gss",                       "           ", 15));
#endif
#ifdef GUROBI
    solvers.emplace_back(Solver(OtherSolverGurobi,            0, "gurobi",                    "I/sh..+./m+", 15));
#endif
#ifdef Z3
    solvers.emplace_back(Solver(OtherSolverZ3,                0, "z3",                        "I/sh..+./m+",  1));
#endif
#ifdef MINISAT
    solvers.emplace_back(Solver(OtherSolverMiniSat,           0, "minisat_minimal",           "S/s...+./m+", 15));
    solvers.emplace_back(Solver(OtherSolverMiniSat,           1, "minisat_natural",           "S/s...+./m+", 15));
    solvers.emplace_back(Solver(OtherSolverMiniSat,           2, "minisat_complete",          "S/sh..+./m+", 15));
    solvers.emplace_back(Solver(OtherSolverMiniSat,           3, "minisat_augmented",         "S/shrc+./m+", 15));
#endif
#ifdef TDEV
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      0, "_tdev_dpll_triad",          "S/shrc+./m.", 15));
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      1, "_tdev_dpll_triad_scc_i",    "S/shrc++/m.", 15));
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      2, "_tdev_dpll_triad_scc_h",    "S/shrc+./m+", 15));
    solvers.emplace_back(Solver(TdokuSolverDpllTriadScc,      3, "_tdev_dpll_triad_scc_ih",   "S/shrc++/m+", 15));
    solvers.emplace_back(Solver(TdokuSolverBasic,             0, "_tdev_basic",               "G/....../..", 15));
    solvers.emplace_back(Solver(TdokuSolverBasic,             1, "_tdev_basic_heuristic",     "G/s...../m.", 15));
#endif
#ifdef LHL
    solvers.emplace_back(Solver(OtherSolverLHLSudoku,         0, "lhl_sudoku",                "G/s...../m.", 14));
#endif
#ifdef ZERODOKU
    solvers.emplace_back(Solver(OtherSolverZeroDoku,          0, "zerodoku",                  "G/sh..../m.", 14));
#endif
#ifdef FAST_SOLV_9R2
    solvers.emplace_back(Solver(OtherSolverFastSolv9r2,       0, "fast_solv_9r2",             "E/sh..../m.", 14));
#endif
#ifdef KUDOKU
    solvers.emplace_back(Solver(OtherSolverKudoku,            0, "kudoku",                    "E/sh..../m.", 15));
#endif
#ifdef NORVIG
    solvers.emplace_back(Solver(OtherSolverNorvig,            0, "norvig",                    "C/sh..../m.", 15));
#endif
#ifdef BB_SUDOKU
    solvers.emplace_back(Solver(OtherSolverBBSudoku,          0, "bb_sudoku",                 "C/shrc../m.", 15));
#endif
#ifdef FSSS
    solvers.emplace_back(Solver(OtherSolverFsss,              0, "fsss",                      "C/shrc../m.", 11));
#endif
#ifdef JSOLVE
    solvers.emplace_back(Solver(OtherSolverJSolve,            0, "jsolve",                    "C/shrc../m.", 15));
#endif
#ifdef FSSS2
    solvers.emplace_back(Solver(OtherSolverFsss2,             0, "fsss2",                     "D/sh..../m.", 10));
    solvers.emplace_back(Solver(OtherSolverFsss2,             1, "fsss2_locked",              "D/shrc../m.", 10));
#endif
#ifdef JCZSOLVE
    solvers.emplace_back(Solver(OtherSolverJCZSolve,          0, "jczsolve",                  "B/shr.../m.", 15));
#endif
#ifdef SK_BFORCE2
    solvers.emplace_back(Solver(OtherSolverSKBFORCE2,         0, "sk_bforce2",                "B/shrc-./m+", 10));
#endif
#ifdef RUST_SUDOKU
    solvers.emplace_back(Solver(OtherSolverRustSudoku,        0, "rust_sudoku",               "B/shr.../m.", 14));
#endif
    solvers.emplace_back(Solver(TdokuSolverDpllTriadSimd,     0, "tdoku",                     "T/shrc+./m+", 15));
    // @formatter:on
    return solvers;
}